

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O0

void __thiscall
IRT::CEseqFloatVisitor::processCallArgument
          (CEseqFloatVisitor *this,CExpression *argExp,CExpressionList *tempExpressionList,
          vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
          *helpStatements)

{
  CEseqExpression *pCVar1;
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *this_00;
  CStatement *pCVar2;
  CTempExpression *pCVar3;
  CExpression *pCVar4;
  CMoveStatement *this_01;
  CEseqExpression *local_c0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_a8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_a0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_98;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_90;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_88;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_80;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_78;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_70;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> source;
  CTemp argTemp;
  value_type local_38;
  CEseqExpression *local_30;
  CEseqExpression *argEseq;
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *helpStatements_local;
  CExpressionList *tempExpressionList_local;
  CExpression *argExp_local;
  CEseqFloatVisitor *this_local;
  
  argEseq = (CEseqExpression *)helpStatements;
  helpStatements_local =
       (vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
        *)tempExpressionList;
  tempExpressionList_local = (CExpressionList *)argExp;
  argExp_local = (CExpression *)this;
  if (argExp == (CExpression *)0x0) {
    local_c0 = (CEseqExpression *)0x0;
  }
  else {
    local_c0 = (CEseqExpression *)
               __dynamic_cast(argExp,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  pCVar1 = argEseq;
  local_30 = local_c0;
  if (local_c0 != (CEseqExpression *)0x0) {
    pCVar2 = CEseqExpression::getStatement(local_c0);
    (*(pCVar2->super_IStatement).super_INode._vptr_INode[3])();
    std::
    vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ::push_back((vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                 *)pCVar1,&local_38);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_38);
  }
  CTemp::CTemp((CTemp *)&source);
  this_00 = helpStatements_local;
  pCVar3 = (CTempExpression *)operator_new(0x28);
  CTempExpression::CTempExpression(pCVar3,(CTemp *)&source);
  CExpressionList::Add((CExpressionList *)this_00,(CExpression *)pCVar3);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_70);
  if (local_30 == (CEseqExpression *)0x0) {
    (*(tempExpressionList_local->super_IExpression).super_INode._vptr_INode[3])(&local_80);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
              (&local_70,&local_80);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_80);
  }
  else {
    pCVar4 = CEseqExpression::getExpression(local_30);
    (*(pCVar4->super_IExpression).super_INode._vptr_INode[3])(&local_78);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
              (&local_70,&local_78);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_78);
  }
  pCVar1 = argEseq;
  this_01 = (CMoveStatement *)operator_new(0x18);
  pCVar3 = (CTempExpression *)operator_new(0x28);
  CTempExpression::CTempExpression(pCVar3,(CTemp *)&source);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_a0,(pointer)pCVar3);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_98,&local_a0);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_90,&local_98);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_a8,&local_70);
  CMoveStatement::CMoveStatement(this_01,&local_90,&local_a8);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_88,(pointer)this_01);
  std::
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  ::push_back((vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
               *)pCVar1,(value_type *)&local_88);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_88);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_a8);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_90);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_98);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_a0);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_70);
  CTemp::~CTemp((CTemp *)&source);
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::processCallArgument(
        const IRT::CExpression *argExp,
        IRT::CExpressionList *tempExpressionList,
        std::vector<std::unique_ptr<const IRT::CStatement>> &helpStatements) {

    const CEseqExpression* argEseq = CAST_TO_ESEQ(argExp);

    if (argEseq != nullptr) {
        helpStatements.push_back(std::move(argEseq->getStatement()->Copy()));
    }

    CTemp argTemp;
    tempExpressionList->Add(new CTempExpression(argTemp));

    std::unique_ptr<const CExpression> source;
    if (argEseq != nullptr) {
        source = std::move(argEseq->getExpression()->Copy());
    } else {
        source = std::move(argExp->Copy());
    }

    helpStatements.push_back(SMOVE_UNIQ(new CMoveStatement(
            EMOVE_UNIQ(EMOVE_UNIQ(new CTempExpression(argTemp))),
            std::move(source)
    )));
}